

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

void __thiscall
AccelParam::StartSpeedControl
          (AccelParam *this,double _startSpeed,double _targetSpeed,double _deltaDist,
          double _startTime,double _targetTime,LTAircraft *pAc)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double speed;
  string local_38;
  
  if (_targetTime <= _startTime) {
    return;
  }
  if (_targetTime <= currCycle.simTime) {
    return;
  }
  bVar1 = dequal(_deltaDist,0.0);
  speed = _targetSpeed;
  if (bVar1) goto LAB_00141714;
  dVar2 = _targetTime - _startTime;
  bVar1 = dequal(dVar2,0.0);
  if (bVar1) goto LAB_00141714;
  speed = _deltaDist / dVar2;
  if ((_startSpeed <= speed) || (speed <= _targetSpeed)) {
    if ((speed <= _startSpeed) || (_targetSpeed <= speed)) {
      bVar1 = DataRefs::GetDebugAcPos(&dataRefs,&(pAc->fd->acKey).key);
      if ((bVar1) && ((int)dataRefs.iLogLevel < 1)) {
        LTAircraft::operator_cast_to_string(&local_38,pAc);
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
               ,0x1d3,"StartSpeedControl",logDEBUG,
               "CONSTANT SPEED due impossible speeds (start=%.1f,avg=%.1f=%.1fm/%.1fs,target=%.1f) for %s"
               ,_startSpeed,speed,_deltaDist,dVar2,_targetSpeed,local_38._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_38);
      }
      SetSpeed(this,speed);
      return;
    }
    dVar3 = speed - (_targetSpeed - speed);
    if (_startSpeed < dVar3) goto LAB_0014176e;
  }
  else {
    dVar3 = (speed - _targetSpeed) + speed;
    if (dVar3 < _startSpeed) {
LAB_0014176e:
      _startSpeed = dVar3;
    }
  }
  dVar3 = _targetSpeed - _startSpeed;
  dVar2 = ((dVar2 * _startSpeed + dVar3 * 0.5 * _targetTime) - _deltaDist) * (2.0 / dVar3);
  if (dVar2 <= _targetTime) {
    SetSpeed(this,_startSpeed);
    this->startSpeed = _startSpeed;
    this->targetSpeed = _targetSpeed;
    this->acceleration = dVar3 / (_targetTime - dVar2);
    this->targetDeltaDist = _deltaDist;
    this->startTime = _startTime;
    if (_startTime <= dVar2) {
      _startTime = dVar2;
    }
    this->accelStartTime = _startTime;
    this->targetTime = _targetTime;
    return;
  }
  if ((int)dataRefs.iLogLevel < 4) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
           ,0x1f7,"StartSpeedControl",logERR,
           "tx <= _targetTime violated for %s (tx = %.1f | %.1f, %.1f, %.1f, %.1f, %.1f)",dVar2,
           _startSpeed,_targetSpeed,_deltaDist,_startTime,(pAc->fd->acKey).key._M_dataplus._M_p);
  }
LAB_00141714:
  SetSpeed(this,speed);
  return;
}

Assistant:

void AccelParam::StartSpeedControl(double _startSpeed, double _targetSpeed,
                                   double _deltaDist,
                                   double _startTime, double _targetTime,
                                   const LTAircraft* pAc)
{
    // Sanity checks
    if (_targetTime <= currCycle.simTime || _startTime >= _targetTime)
        return;

    const double deltaTime = _targetTime - _startTime;
    const double avgSpeed = _deltaDist / deltaTime;
    
    // Sanity checks: ∆distance and ∆t should not be too close to zero
    if (dequal(_deltaDist, 0) || dequal(deltaTime, 0)) {
        SetSpeed(_targetSpeed);
        return;
    }

    // If current speed and target speed are on opposite sides of
    // average speed then we can continue with current speed
    // up to a point from which we accelerate/decelerate to 'to'-position
    // (formula documentation see Notes.txt)
    // tx =  2/∆v * (vi * ∆t + ∆v/2 * tt - d)
    
    // decelerate (currently above avg, target below avg: keep current speed
    // until it is time [tx] to deceleration)
    if (_startSpeed > avgSpeed && avgSpeed > _targetSpeed)
    {
        // is startSpeed too fast? (too far on the other side of average?)
        if (_startSpeed > avgSpeed + (avgSpeed - _targetSpeed))
            // too fast, so we reduce startSpart to mirror targetSpeed on the other side of average speed
            _startSpeed = avgSpeed + (avgSpeed - _targetSpeed);
    }
    // accelerate (currently below avg, target above)
    else if (_startSpeed < avgSpeed && avgSpeed < _targetSpeed)
    {
        // is startSpeed too slow? (too far on the other side of average?)
        if (_startSpeed < avgSpeed - (_targetSpeed - avgSpeed))
            // too slow, increase to mirror targetSPeed
            _startSpeed = avgSpeed - (_targetSpeed - avgSpeed);
        
    }
    // no way of complying to input parameters under our conditions:
    // set constant speed and return
    else {
        // output debug info on request
        if (dataRefs.GetDebugAcPos(pAc->key())) {
            LOG_MSG(logDEBUG,"CONSTANT SPEED due impossible speeds (start=%.1f,avg=%.1f=%.1fm/%.1fs,target=%.1f) for %s",
                    _startSpeed,
                    avgSpeed, _deltaDist, deltaTime,
                    _targetSpeed,
                    std::string(*pAc).c_str());
        }
        SetSpeed(avgSpeed);
        return;
    }
    
    // continue with dynamic speed:
    // calc the time when to start speed change
    const double deltaSpeed = _targetSpeed - _startSpeed;
    const double tx = 2/deltaSpeed * (_startSpeed * deltaTime +
                         deltaSpeed/2 * _targetTime -
                         _deltaDist);
    const double accel = deltaSpeed / (_targetTime - tx);
    
    // set object's values
    if (tx <= _targetTime) {            // expected...but in rare edge cases it seems possible to be violated
        SetSpeed(_startSpeed);          // reset, then set to calculated values:
        startSpeed = _startSpeed;
        targetSpeed = _targetSpeed;
        acceleration = accel;
        targetDeltaDist = _deltaDist;
        startTime = _startTime;
        accelStartTime = std::max(tx, _startTime);
        targetTime = _targetTime;
    //    if (dataRefs.GetDebugAcPos(pAc->key())) {
    //        LOG_MSG(logDEBUG,"%s: start=%.1f, in %.1fs: accel=%.1f,target=%.1f) for %s",
    //                acceleration >= 0.0 ? "ACCELERATION" : "DECELERATION",
    //                startSpeed,
    //                accelStartTime - startTime,
    //                acceleration,
    //                targetSpeed,
    //                std::string(*pAc).c_str());
    //    }
    } else {
        LOG_MSG(logERR, "tx <= _targetTime violated for %s (tx = %.1f | %.1f, %.1f, %.1f, %.1f, %.1f)",
                pAc->key().c_str(), tx,
                _startSpeed, _targetSpeed, _deltaDist, _startTime, _targetTime);
        SetSpeed(avgSpeed);
        return;
    }
}